

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O3

bool __thiscall mjs::object::has_property(object *this,wstring_view *name)

{
  int iVar1;
  bool bVar2;
  
  iVar1 = (*this->_vptr_object[6])();
  bVar2 = true;
  while ((iVar1 == 0x10 && (bVar2 = (this->prototype_).pos_ != 0, bVar2))) {
    this = gc_heap_ptr_untracked<mjs::object,_true>::dereference(&this->prototype_,this->heap_);
    iVar1 = (*this->_vptr_object[6])(this,name);
  }
  return bVar2;
}

Assistant:

bool object::has_property(const std::wstring_view& name) const {
    if (own_property_attributes(name) != property_attribute::invalid) {
        return true;
    }
    return prototype_ && prototype_.dereference(heap()).has_property(name);
}